

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_modifier.cpp
# Opt level: O3

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::LimitPercentModifier::Copy(LimitPercentModifier *this)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  pointer pPVar3;
  pointer pLVar4;
  long in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_20;
  _Head_base<0UL,_duckdb::LimitPercentModifier_*,_false> local_18;
  
  local_18._M_head_impl = (LimitPercentModifier *)operator_new(0x20);
  ((local_18._M_head_impl)->super_ResultModifier).type = LIMIT_PERCENT_MODIFIER;
  ((local_18._M_head_impl)->super_ResultModifier)._vptr_ResultModifier =
       (_func_int **)&PTR__LimitPercentModifier_02432dc8;
  ((local_18._M_head_impl)->limit).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  ((local_18._M_head_impl)->offset).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  if (*(long *)(in_RSI + 0x10) != 0) {
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)(in_RSI + 0x10));
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_20,pPVar3);
    pLVar4 = unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
             ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                           *)&local_18);
    _Var2._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (ParsedExpression *)0x0;
    _Var1._M_head_impl =
         (pLVar4->limit).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar4->limit).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      if (local_20._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
  }
  if (*(long *)(in_RSI + 0x18) != 0) {
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)(in_RSI + 0x18));
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_20,pPVar3);
    pLVar4 = unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
             ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                           *)&local_18);
    _Var2._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (ParsedExpression *)0x0;
    _Var1._M_head_impl =
         (pLVar4->offset).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar4->offset).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      if (local_20._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
  }
  (this->super_ResultModifier)._vptr_ResultModifier = (_func_int **)local_18._M_head_impl;
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)this;
}

Assistant:

unique_ptr<ResultModifier> LimitPercentModifier::Copy() const {
	auto copy = make_uniq<LimitPercentModifier>();
	if (limit) {
		copy->limit = limit->Copy();
	}
	if (offset) {
		copy->offset = offset->Copy();
	}
	return std::move(copy);
}